

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void shufps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  _Bool _Var2;
  undefined8 uVar3;
  OPTYPE *pMyOperand;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar1 == '\x01') {
      uVar3 = 0x64706675687376;
    }
    else {
      if (UVar1 != '\0') {
LAB_00120dcf:
        failDecode(pMyDisasm);
        return;
      }
      uVar3 = 0x73706675687376;
    }
    *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    }
    ArgsVEX(pMyDisasm);
    pMyOperand = &pMyDisasm->Operand4;
  }
  else {
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x50015;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"shufpd",7);
    }
    else {
      _Var2 = prefixes_present(pMyDisasm);
      if (_Var2) goto LAB_00120dcf;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x40015;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"shufps",7);
    }
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 1;
    pMyOperand = &pMyDisasm->Operand3;
  }
  getImmediat8(pMyOperand,pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ shufps_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 0) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vshufps");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
    }
    else if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vshufpd");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    /* ========== 0x66 */
    if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+SHUFFLE_UNPACK;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "shufpd");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
    else {
      if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHUFFLE_UNPACK;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "shufps");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
    pMyDisasm->Operand1.AccessMode = READ;
    getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
  }
}